

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

SurfaceInteraction * __thiscall pbrt::Transform::operator()(Transform *this,SurfaceInteraction *si)

{
  undefined8 uVar1;
  Normal3<float> n;
  Normal3<float> n2;
  Normal3<float> n_00;
  Vector3<float> v;
  Vector3<float> v_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Vector3<float> v_05;
  Normal3<float> n_01;
  Normal3<float> n_02;
  Normal3<float> n_03;
  Normal3<float> n_04;
  Normal3<float> n_05;
  Normal3<float> n_06;
  long in_RDX;
  Material *in_RSI;
  SurfaceInteraction *in_RDI;
  undefined1 auVar19 [56];
  undefined1 auVar3 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Normal3<float> NVar20;
  Vector3<float> VVar21;
  Point3fi *in_stack_00000078;
  Transform *in_stack_00000080;
  Transform *t;
  SurfaceInteraction *ret;
  SurfaceInteraction *this_00;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  float in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  float fVar22;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffffc14;
  float fVar24;
  Transform *in_stack_fffffffffffffc78;
  Transform *this_01;
  Transform *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffffc94;
  float in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  float in_stack_fffffffffffffca8;
  Interval local_38;
  Interval IStack_30;
  Interval local_28;
  undefined1 auVar2 [64];
  undefined1 auVar4 [64];
  
  this_00 = in_RDI;
  SurfaceInteraction::SurfaceInteraction(in_RDI);
  operator()(in_stack_00000080,in_stack_00000078);
  (this_00->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = local_28;
  (this_00->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = local_38;
  (this_00->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IStack_30;
  auVar19 = ZEXT856(0);
  n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffca0;
  n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(in_stack_fffffffffffffc88,n_01);
  auVar2._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar2._8_56_ = auVar19;
  vmovlpd_avx(auVar2._0_16_);
  auVar19 = ZEXT856(0);
  NVar20.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffbdc;
  NVar20.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffbd8;
  NVar20.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffbe0;
  NVar20 = Normalize<float>(NVar20);
  auVar3._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar3._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc98;
  VVar21 = operator()(in_stack_fffffffffffffc78,v);
  auVar4._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar19;
  vmovlpd_avx(auVar4._0_16_);
  auVar19 = ZEXT856(0);
  VVar21.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffbdc;
  VVar21.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffbd8;
  VVar21.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffbe0;
  VVar21 = Normalize<float>(VVar21);
  auVar5._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  (this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (this_00->super_Interaction).time = *(Float *)(in_RDX + 0x18);
  (this_00->super_Interaction).mediumInterface = *(MediumInterface **)(in_RDX + 0x40);
  (this_00->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> =
       *(Tuple2<pbrt::Point2,_float> *)(in_RDX + 0x34);
  auVar19 = ZEXT856(0);
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc98;
  VVar21 = operator()(in_stack_fffffffffffffc78,v_00);
  auVar6._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  (this_00->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (this_00->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc98;
  VVar21 = operator()(in_stack_fffffffffffffc78,v_01);
  auVar7._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  (this_00->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (this_00->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  n_02.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_02.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffca0;
  n_02.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(in_stack_fffffffffffffc88,n_02);
  auVar8._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar8._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  (this_00->dndu).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z
  ;
  (this_00->dndu).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->dndu).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  n_03.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_03.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffca0;
  n_03.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(in_stack_fffffffffffffc88,n_03);
  auVar9._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  (this_00->dndv).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z
  ;
  (this_00->dndv).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->dndv).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  n_04.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_04.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffca0;
  n_04.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(in_stack_fffffffffffffc88,n_04);
  auVar10._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar19;
  vmovlpd_avx(auVar10._0_16_);
  auVar19 = ZEXT856(0);
  n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffbdc;
  n.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffbd8;
  n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffbe0;
  NVar20 = Normalize<float>(n);
  auVar11._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar11._0_16_);
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  v_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc98;
  VVar21 = operator()(in_stack_fffffffffffffc78,v_02);
  auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar12._0_16_);
  (this_00->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (this_00->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  v_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc98;
  VVar21 = operator()(in_stack_fffffffffffffc78,v_03);
  auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  (this_00->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (this_00->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar19 = ZEXT856(0);
  n_05.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_05.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffca0;
  n_05.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(in_stack_fffffffffffffc88,n_05);
  auVar14._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar14._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar14._0_16_);
  (this_00->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  (this_00->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  uVar25 = *(undefined4 *)(in_RDX + 0xb8);
  fVar22 = SUB84(*(Transform **)(in_RDX + 0xb0),0);
  auVar19 = ZEXT856(0);
  n_06.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffca4;
  n_06.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar25;
  n_06.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffca8;
  NVar20 = operator()(*(Transform **)(in_RDX + 0xb0),n_06);
  auVar15._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar15._8_56_ = auVar19;
  this_01 = (Transform *)vmovlpd_avx(auVar15._0_16_);
  (this_00->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  *(Transform **)&(this_00->shading).dndv.super_Tuple3<pbrt::Normal3,_float> = this_01;
  this_00->dudx = *(Float *)(in_RDX + 0xe8);
  this_00->dvdx = *(Float *)(in_RDX + 0xec);
  this_00->dudy = *(Float *)(in_RDX + 0xf0);
  this_00->dvdy = *(Float *)(in_RDX + 0xf4);
  auVar19 = ZEXT856(0);
  v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar25;
  v_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar22;
  VVar21 = operator()(this_01,v_04);
  auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar16._0_16_);
  (this_00->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (this_00->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  uVar23 = *(undefined4 *)(in_RDX + 0xe4);
  fVar24 = (float)*(undefined8 *)(in_RDX + 0xdc);
  auVar19 = ZEXT856(0);
  v_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc94;
  v_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar25;
  v_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar22;
  VVar21 = operator()(this_01,v_05);
  auVar17._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar17._0_16_);
  fVar22 = (float)uVar1;
  (this_00->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (this_00->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this_00->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  Material::operator=((Material *)this_00,in_RSI);
  Light::operator=((Light *)this_00,(Light *)in_RSI);
  auVar19 = ZEXT856(0);
  n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffc14;
  n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar23;
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar24;
  n2.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffbf4;
  n2.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffbf0;
  n2.super_Tuple3<pbrt::Normal3,_float>.z = fVar22;
  NVar20 = FaceForward<float>(n_00,n2);
  auVar18._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar18._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar18._0_16_);
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  this_00->faceIndex = *(int *)(in_RDX + 0xbc);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU SurfaceInteraction Transform::operator()(const SurfaceInteraction &si) const {
    SurfaceInteraction ret;
    const Transform &t = *this;
    ret.pi = t(si.pi);
    // Transform remaining members of _SurfaceInteraction_
    ret.n = Normalize(t(si.n));
    ret.wo = Normalize(t(si.wo));
    ret.time = si.time;
    ret.mediumInterface = si.mediumInterface;
    ret.uv = si.uv;
    ret.dpdu = t(si.dpdu);
    ret.dpdv = t(si.dpdv);
    ret.dndu = t(si.dndu);
    ret.dndv = t(si.dndv);
    ret.shading.n = Normalize(t(si.shading.n));
    ret.shading.dpdu = t(si.shading.dpdu);
    ret.shading.dpdv = t(si.shading.dpdv);
    ret.shading.dndu = t(si.shading.dndu);
    ret.shading.dndv = t(si.shading.dndv);
    ret.dudx = si.dudx;
    ret.dvdx = si.dvdx;
    ret.dudy = si.dudy;
    ret.dvdy = si.dvdy;
    ret.dpdx = t(si.dpdx);
    ret.dpdy = t(si.dpdy);
    ret.material = si.material;
    ret.areaLight = si.areaLight;
    //    ret.n = FaceForward(ret.n, ret.shading.n);
    ret.shading.n = FaceForward(ret.shading.n, ret.n);
    ret.faceIndex = si.faceIndex;

    return ret;
}